

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

CTcPrsSymtab * __thiscall CTcCodeStream::set_local_frame(CTcCodeStream *this,CTcPrsSymtab *symtab)

{
  CTcCodeStream *in_RSI;
  long in_RDI;
  CTcPrsSymtab *old_frame;
  CTcPrsSymtab *this_00;
  
  this_00 = *(CTcPrsSymtab **)(in_RDI + 0xe8);
  if (this_00 != (CTcPrsSymtab *)0x0) {
    CTcPrsSymtab::add_to_range
              (this_00,(int)*(undefined8 *)(in_RDI + 8) - (int)*(undefined8 *)(in_RDI + 200));
  }
  *(CTcCodeStream **)(in_RDI + 0xe8) = in_RSI;
  add_local_frame(in_RSI,this_00);
  CTcPrsSymtab::add_to_range
            ((CTcPrsSymtab *)in_RSI,
             (int)*(undefined8 *)(in_RDI + 8) - (int)*(undefined8 *)(in_RDI + 200));
  return this_00;
}

Assistant:

CTcPrsSymtab *CTcCodeStream::set_local_frame(CTcPrsSymtab *symtab)
{
    /* remember the original local frame, so we can return it later */
    CTcPrsSymtab *old_frame = cur_frame_;

    /* add the current byte code location to the outgoing frame */
    if (old_frame != 0)
        old_frame->add_to_range(ofs_ - method_ofs_);

    /* remember the current frame */
    cur_frame_ = symtab;

    /* add it to the local frame list for the method if necessary */
    add_local_frame(symtab);

    /* add the current byte code location to the incoming frame */
    symtab->add_to_range(ofs_ - method_ofs_);

    /* return the original local frame */
    return old_frame;
}